

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_257,_true,_embree::avx::VirtualCurveIntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  bool bVar8;
  char cVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  undefined4 uVar13;
  ulong unaff_RBX;
  ulong uVar14;
  ulong uVar15;
  NodeRef *pNVar16;
  NodeRef *pNVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  vint4 ai;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 ai_1;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi_1;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  vint4 bi_3;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  vint4 bi;
  undefined1 auVar43 [16];
  float fVar44;
  float fVar46;
  float fVar47;
  undefined1 auVar45 [16];
  float fVar48;
  float fVar49;
  float fVar53;
  float fVar54;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar55;
  float fVar56;
  float fVar60;
  float fVar61;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  NodeRef stack [244];
  
  stack[0] = root;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar66._4_4_ = fVar1;
  auVar66._0_4_ = fVar1;
  auVar66._8_4_ = fVar1;
  auVar66._12_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar67._4_4_ = fVar2;
  auVar67._0_4_ = fVar2;
  auVar67._8_4_ = fVar2;
  auVar67._12_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar63._4_4_ = fVar3;
  auVar63._0_4_ = fVar3;
  auVar63._8_4_ = fVar3;
  auVar63._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar5 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar44 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar46 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar47 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar40 = ZEXT416((uint)(fVar44 * 0.99999964));
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar41 = ZEXT416((uint)(fVar46 * 0.99999964));
  auVar41 = vshufps_avx(auVar41,auVar41,0);
  auVar36 = ZEXT416((uint)(fVar47 * 0.99999964));
  auVar36 = vshufps_avx(auVar36,auVar36,0);
  auVar22 = ZEXT416((uint)(fVar44 * 1.0000004));
  auVar22 = vshufps_avx(auVar22,auVar22,0);
  auVar23 = ZEXT416((uint)(fVar46 * 1.0000004));
  auVar23 = vshufps_avx(auVar23,auVar23,0);
  auVar24 = ZEXT416((uint)(fVar47 * 1.0000004));
  auVar24 = vshufps_avx(auVar24,auVar24,0);
  uVar20 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar7 = (tray->tnear).field_0.i[k];
  auVar50._4_4_ = iVar7;
  auVar50._0_4_ = iVar7;
  auVar50._8_4_ = iVar7;
  auVar50._12_4_ = iVar7;
  iVar7 = (tray->tfar).field_0.i[k];
  auVar57._4_4_ = iVar7;
  auVar57._0_4_ = iVar7;
  auVar57._8_4_ = iVar7;
  auVar57._12_4_ = iVar7;
  pNVar17 = stack + 1;
  do {
    pNVar16 = pNVar17;
    if (pNVar16 == stack) break;
    pNVar17 = pNVar16 + -1;
    sVar19 = pNVar16[-1].ptr;
    do {
      if ((sVar19 & 0xf) == 0) {
        auVar29 = vsubps_avx(*(undefined1 (*) [16])(sVar19 + 0x20 + uVar20),auVar66);
        auVar25._0_4_ = auVar40._0_4_ * auVar29._0_4_;
        auVar25._4_4_ = auVar40._4_4_ * auVar29._4_4_;
        auVar25._8_4_ = auVar40._8_4_ * auVar29._8_4_;
        auVar25._12_4_ = auVar40._12_4_ * auVar29._12_4_;
        auVar29 = vsubps_avx(*(undefined1 (*) [16])(sVar19 + 0x20 + uVar21),auVar67);
        auVar30._0_4_ = auVar41._0_4_ * auVar29._0_4_;
        auVar30._4_4_ = auVar41._4_4_ * auVar29._4_4_;
        auVar30._8_4_ = auVar41._8_4_ * auVar29._8_4_;
        auVar30._12_4_ = auVar41._12_4_ * auVar29._12_4_;
        auVar29 = vmaxps_avx(auVar25,auVar30);
        auVar58 = vsubps_avx(*(undefined1 (*) [16])(sVar19 + 0x20 + uVar14),auVar63);
        auVar31._0_4_ = auVar36._0_4_ * auVar58._0_4_;
        auVar31._4_4_ = auVar36._4_4_ * auVar58._4_4_;
        auVar31._8_4_ = auVar36._8_4_ * auVar58._8_4_;
        auVar31._12_4_ = auVar36._12_4_ * auVar58._12_4_;
        auVar58 = vsubps_avx(*(undefined1 (*) [16])(sVar19 + 0x20 + (uVar20 ^ 0x10)),auVar66);
        auVar34._0_4_ = auVar22._0_4_ * auVar58._0_4_;
        auVar34._4_4_ = auVar22._4_4_ * auVar58._4_4_;
        auVar34._8_4_ = auVar22._8_4_ * auVar58._8_4_;
        auVar34._12_4_ = auVar22._12_4_ * auVar58._12_4_;
        auVar58 = vsubps_avx(*(undefined1 (*) [16])(sVar19 + 0x20 + (uVar21 ^ 0x10)),auVar67);
        auVar37._0_4_ = auVar23._0_4_ * auVar58._0_4_;
        auVar37._4_4_ = auVar23._4_4_ * auVar58._4_4_;
        auVar37._8_4_ = auVar23._8_4_ * auVar58._8_4_;
        auVar37._12_4_ = auVar23._12_4_ * auVar58._12_4_;
        auVar28 = vminps_avx(auVar34,auVar37);
        auVar58 = vsubps_avx(*(undefined1 (*) [16])(sVar19 + 0x20 + (uVar14 ^ 0x10)),auVar63);
        auVar38._0_4_ = auVar24._0_4_ * auVar58._0_4_;
        auVar38._4_4_ = auVar24._4_4_ * auVar58._4_4_;
        auVar38._8_4_ = auVar24._8_4_ * auVar58._8_4_;
        auVar38._12_4_ = auVar24._12_4_ * auVar58._12_4_;
        auVar58 = vmaxps_avx(auVar31,auVar50);
        auVar29 = vmaxps_avx(auVar29,auVar58);
        auVar58 = vminps_avx(auVar38,auVar57);
        auVar58 = vminps_avx(auVar28,auVar58);
        auVar29 = vcmpps_avx(auVar29,auVar58,2);
LAB_00371e5e:
        uVar13 = vmovmskps_avx(auVar29);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar13);
        bVar8 = true;
      }
      else {
        if ((int)(sVar19 & 0xf) == 2) {
          uVar18 = sVar19 & 0xfffffffffffffff0;
          auVar58._0_4_ =
               fVar5 * *(float *)(uVar18 + 0x50) + fVar6 * *(float *)(uVar18 + 0x80) +
               fVar4 * *(float *)(uVar18 + 0x20);
          auVar58._4_4_ =
               fVar5 * *(float *)(uVar18 + 0x54) + fVar6 * *(float *)(uVar18 + 0x84) +
               fVar4 * *(float *)(uVar18 + 0x24);
          auVar58._8_4_ =
               fVar5 * *(float *)(uVar18 + 0x58) + fVar6 * *(float *)(uVar18 + 0x88) +
               fVar4 * *(float *)(uVar18 + 0x28);
          auVar58._12_4_ =
               fVar5 * *(float *)(uVar18 + 0x5c) + fVar6 * *(float *)(uVar18 + 0x8c) +
               fVar4 * *(float *)(uVar18 + 0x2c);
          auVar45._0_4_ =
               fVar6 * *(float *)(uVar18 + 0x90) + fVar5 * *(float *)(uVar18 + 0x60) +
               fVar4 * *(float *)(uVar18 + 0x30);
          auVar45._4_4_ =
               fVar6 * *(float *)(uVar18 + 0x94) + fVar5 * *(float *)(uVar18 + 100) +
               fVar4 * *(float *)(uVar18 + 0x34);
          auVar45._8_4_ =
               fVar6 * *(float *)(uVar18 + 0x98) + fVar5 * *(float *)(uVar18 + 0x68) +
               fVar4 * *(float *)(uVar18 + 0x38);
          auVar45._12_4_ =
               fVar6 * *(float *)(uVar18 + 0x9c) + fVar5 * *(float *)(uVar18 + 0x6c) +
               fVar4 * *(float *)(uVar18 + 0x3c);
          auVar51._0_4_ =
               fVar6 * *(float *)(uVar18 + 0xa0) + fVar5 * *(float *)(uVar18 + 0x70) +
               fVar4 * *(float *)(uVar18 + 0x40);
          auVar51._4_4_ =
               fVar6 * *(float *)(uVar18 + 0xa4) + fVar5 * *(float *)(uVar18 + 0x74) +
               fVar4 * *(float *)(uVar18 + 0x44);
          auVar51._8_4_ =
               fVar6 * *(float *)(uVar18 + 0xa8) + fVar5 * *(float *)(uVar18 + 0x78) +
               fVar4 * *(float *)(uVar18 + 0x48);
          auVar51._12_4_ =
               fVar6 * *(float *)(uVar18 + 0xac) + fVar5 * *(float *)(uVar18 + 0x7c) +
               fVar4 * *(float *)(uVar18 + 0x4c);
          auVar65._8_4_ = 0x7fffffff;
          auVar65._0_8_ = 0x7fffffff7fffffff;
          auVar65._12_4_ = 0x7fffffff;
          auVar29 = vandps_avx(auVar58,auVar65);
          auVar26._8_4_ = 0x219392ef;
          auVar26._0_8_ = 0x219392ef219392ef;
          auVar26._12_4_ = 0x219392ef;
          auVar29 = vcmpps_avx(auVar29,auVar26,1);
          auVar58 = vblendvps_avx(auVar58,auVar26,auVar29);
          auVar29 = vandps_avx(auVar45,auVar65);
          auVar29 = vcmpps_avx(auVar29,auVar26,1);
          auVar28 = vblendvps_avx(auVar45,auVar26,auVar29);
          auVar29 = vandps_avx(auVar51,auVar65);
          auVar29 = vcmpps_avx(auVar29,auVar26,1);
          auVar29 = vblendvps_avx(auVar51,auVar26,auVar29);
          auVar26 = vrcpps_avx(auVar58);
          fVar44 = auVar26._0_4_;
          auVar52._0_4_ = fVar44 * auVar58._0_4_;
          fVar46 = auVar26._4_4_;
          auVar52._4_4_ = fVar46 * auVar58._4_4_;
          fVar47 = auVar26._8_4_;
          auVar52._8_4_ = fVar47 * auVar58._8_4_;
          fVar48 = auVar26._12_4_;
          auVar52._12_4_ = fVar48 * auVar58._12_4_;
          auVar27._8_4_ = 0x3f800000;
          auVar27._0_8_ = &DAT_3f8000003f800000;
          auVar27._12_4_ = 0x3f800000;
          auVar58 = vsubps_avx(auVar27,auVar52);
          fVar44 = fVar44 + fVar44 * auVar58._0_4_;
          fVar46 = fVar46 + fVar46 * auVar58._4_4_;
          fVar47 = fVar47 + fVar47 * auVar58._8_4_;
          fVar48 = fVar48 + fVar48 * auVar58._12_4_;
          auVar58 = vrcpps_avx(auVar28);
          fVar49 = auVar58._0_4_;
          auVar59._0_4_ = fVar49 * auVar28._0_4_;
          fVar53 = auVar58._4_4_;
          auVar59._4_4_ = fVar53 * auVar28._4_4_;
          fVar54 = auVar58._8_4_;
          auVar59._8_4_ = fVar54 * auVar28._8_4_;
          fVar55 = auVar58._12_4_;
          auVar59._12_4_ = fVar55 * auVar28._12_4_;
          auVar58 = vsubps_avx(auVar27,auVar59);
          fVar49 = fVar49 + fVar49 * auVar58._0_4_;
          fVar53 = fVar53 + fVar53 * auVar58._4_4_;
          fVar54 = fVar54 + fVar54 * auVar58._8_4_;
          fVar55 = fVar55 + fVar55 * auVar58._12_4_;
          auVar58 = vrcpps_avx(auVar29);
          fVar56 = auVar58._0_4_;
          auVar64._0_4_ = fVar56 * auVar29._0_4_;
          fVar60 = auVar58._4_4_;
          auVar64._4_4_ = fVar60 * auVar29._4_4_;
          fVar61 = auVar58._8_4_;
          auVar64._8_4_ = fVar61 * auVar29._8_4_;
          fVar62 = auVar58._12_4_;
          auVar64._12_4_ = fVar62 * auVar29._12_4_;
          auVar29 = vsubps_avx(auVar27,auVar64);
          fVar56 = fVar56 + fVar56 * auVar29._0_4_;
          fVar60 = fVar60 + fVar60 * auVar29._4_4_;
          fVar61 = fVar61 + fVar61 * auVar29._8_4_;
          fVar62 = fVar62 + fVar62 * auVar29._12_4_;
          auVar35._0_4_ =
               (fVar1 * *(float *)(uVar18 + 0x20) +
               fVar2 * *(float *)(uVar18 + 0x50) +
               fVar3 * *(float *)(uVar18 + 0x80) + *(float *)(uVar18 + 0xb0)) * -fVar44;
          auVar35._4_4_ =
               (fVar1 * *(float *)(uVar18 + 0x24) +
               fVar2 * *(float *)(uVar18 + 0x54) +
               fVar3 * *(float *)(uVar18 + 0x84) + *(float *)(uVar18 + 0xb4)) * -fVar46;
          auVar35._8_4_ =
               (fVar1 * *(float *)(uVar18 + 0x28) +
               fVar2 * *(float *)(uVar18 + 0x58) +
               fVar3 * *(float *)(uVar18 + 0x88) + *(float *)(uVar18 + 0xb8)) * -fVar47;
          auVar35._12_4_ =
               (fVar1 * *(float *)(uVar18 + 0x2c) +
               fVar2 * *(float *)(uVar18 + 0x5c) +
               fVar3 * *(float *)(uVar18 + 0x8c) + *(float *)(uVar18 + 0xbc)) * -fVar48;
          auVar32._0_4_ =
               (fVar1 * *(float *)(uVar18 + 0x30) +
               fVar2 * *(float *)(uVar18 + 0x60) +
               fVar3 * *(float *)(uVar18 + 0x90) + *(float *)(uVar18 + 0xc0)) * -fVar49;
          auVar32._4_4_ =
               (fVar1 * *(float *)(uVar18 + 0x34) +
               fVar2 * *(float *)(uVar18 + 100) +
               fVar3 * *(float *)(uVar18 + 0x94) + *(float *)(uVar18 + 0xc4)) * -fVar53;
          auVar32._8_4_ =
               (fVar1 * *(float *)(uVar18 + 0x38) +
               fVar2 * *(float *)(uVar18 + 0x68) +
               fVar3 * *(float *)(uVar18 + 0x98) + *(float *)(uVar18 + 200)) * -fVar54;
          auVar32._12_4_ =
               (fVar1 * *(float *)(uVar18 + 0x3c) +
               fVar2 * *(float *)(uVar18 + 0x6c) +
               fVar3 * *(float *)(uVar18 + 0x9c) + *(float *)(uVar18 + 0xcc)) * -fVar55;
          auVar28._0_4_ =
               (fVar1 * *(float *)(uVar18 + 0x40) +
               fVar2 * *(float *)(uVar18 + 0x70) +
               fVar3 * *(float *)(uVar18 + 0xa0) + *(float *)(uVar18 + 0xd0)) * -fVar56;
          auVar28._4_4_ =
               (fVar1 * *(float *)(uVar18 + 0x44) +
               fVar2 * *(float *)(uVar18 + 0x74) +
               fVar3 * *(float *)(uVar18 + 0xa4) + *(float *)(uVar18 + 0xd4)) * -fVar60;
          auVar28._8_4_ =
               (fVar1 * *(float *)(uVar18 + 0x48) +
               fVar2 * *(float *)(uVar18 + 0x78) +
               fVar3 * *(float *)(uVar18 + 0xa8) + *(float *)(uVar18 + 0xd8)) * -fVar61;
          auVar28._12_4_ =
               (fVar1 * *(float *)(uVar18 + 0x4c) +
               fVar2 * *(float *)(uVar18 + 0x7c) +
               fVar3 * *(float *)(uVar18 + 0xac) + *(float *)(uVar18 + 0xdc)) * -fVar62;
          auVar39._0_4_ = fVar44 + auVar35._0_4_;
          auVar39._4_4_ = fVar46 + auVar35._4_4_;
          auVar39._8_4_ = fVar47 + auVar35._8_4_;
          auVar39._12_4_ = fVar48 + auVar35._12_4_;
          auVar42._0_4_ = fVar49 + auVar32._0_4_;
          auVar42._4_4_ = fVar53 + auVar32._4_4_;
          auVar42._8_4_ = fVar54 + auVar32._8_4_;
          auVar42._12_4_ = fVar55 + auVar32._12_4_;
          auVar43._0_4_ = fVar56 + auVar28._0_4_;
          auVar43._4_4_ = fVar60 + auVar28._4_4_;
          auVar43._8_4_ = fVar61 + auVar28._8_4_;
          auVar43._12_4_ = fVar62 + auVar28._12_4_;
          auVar29 = vpminsd_avx(auVar32,auVar42);
          auVar58 = vpminsd_avx(auVar28,auVar43);
          auVar29 = vmaxps_avx(auVar29,auVar58);
          auVar27 = vpminsd_avx(auVar35,auVar39);
          auVar26 = vpmaxsd_avx(auVar35,auVar39);
          auVar58 = vpmaxsd_avx(auVar32,auVar42);
          auVar28 = vpmaxsd_avx(auVar28,auVar43);
          auVar28 = vminps_avx(auVar58,auVar28);
          auVar58 = vmaxps_avx(auVar50,auVar27);
          auVar29 = vmaxps_avx(auVar58,auVar29);
          auVar58 = vminps_avx(auVar57,auVar26);
          auVar58 = vminps_avx(auVar58,auVar28);
          auVar33._0_4_ = auVar29._0_4_ * 0.99999964;
          auVar33._4_4_ = auVar29._4_4_ * 0.99999964;
          auVar33._8_4_ = auVar29._8_4_ * 0.99999964;
          auVar33._12_4_ = auVar29._12_4_ * 0.99999964;
          auVar29._0_4_ = auVar58._0_4_ * 1.0000004;
          auVar29._4_4_ = auVar58._4_4_ * 1.0000004;
          auVar29._8_4_ = auVar58._8_4_ * 1.0000004;
          auVar29._12_4_ = auVar58._12_4_ * 1.0000004;
          auVar29 = vcmpps_avx(auVar33,auVar29,2);
          goto LAB_00371e5e;
        }
        bVar8 = false;
      }
      if (bVar8) {
        if (unaff_RBX == 0) {
          uVar11 = 4;
        }
        else {
          uVar18 = sVar19 & 0xfffffffffffffff0;
          lVar12 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          uVar11 = 0;
          sVar19 = *(size_t *)(uVar18 + lVar12 * 8);
          uVar15 = unaff_RBX - 1 & unaff_RBX;
          if (uVar15 != 0) {
            pNVar17->ptr = sVar19;
            lVar12 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            uVar10 = uVar15 - 1;
            while( true ) {
              pNVar17 = pNVar17 + 1;
              sVar19 = *(size_t *)(uVar18 + lVar12 * 8);
              uVar10 = uVar10 & uVar15;
              if (uVar10 == 0) break;
              pNVar17->ptr = sVar19;
              lVar12 = 0;
              if (uVar10 != 0) {
                for (; (uVar10 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              uVar15 = uVar10 - 1;
            }
          }
        }
      }
      else {
        uVar11 = 6;
      }
    } while (uVar11 == 0);
    if (uVar11 == 6) {
      cVar9 = (**(code **)((long)This->leafIntersector +
                          (ulong)*(byte *)(sVar19 & 0xfffffffffffffff0) * 0x40 + 0x18))(pre,ray,k);
      uVar11 = 0;
      if (cVar9 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar11 = 1;
      }
    }
  } while ((uVar11 & 3) == 0);
  return pNVar16 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }